

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O1

ClauseIterator __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::retrieveVariants
          (SubstitutionTreeClauseVariantIndex *this,Literal **lits,uint length)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  Literal *pLVar5;
  Entry *pEVar6;
  uint in_ECX;
  undefined4 in_register_00000014;
  Literal **key;
  SubstitutionTreeClauseVariantIndex *this_00;
  Literal *pLVar7;
  List<Kernel::Clause_*> *pLVar8;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  LiteralMiniIndex *local_120;
  LiteralMiniIndex *local_118;
  _func_int **local_110;
  _func_int **local_108;
  char local_100;
  undefined8 local_f8;
  ResultClauseToVariantClauseFn local_f0;
  ResultClauseToVariantClauseFn local_c8;
  _func_int **local_a0;
  ResultClauseToVariantClauseFn local_98;
  ResultClauseToVariantClauseFn local_70;
  _func_int **local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  key = (Literal **)CONCAT44(in_register_00000014,length);
  if (in_ECX == 1) {
    this_00 = (SubstitutionTreeClauseVariantIndex *)*key;
    uVar3 = Kernel::Term::numVarOccs((Term *)this_00);
    if (uVar3 == 0) {
      pEVar6 = ::Lib::
               DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry((DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)(lits + 1),key);
      if (pEVar6 != (Entry *)0x0) {
        pLVar8 = pEVar6->_val;
        goto LAB_002c119d;
      }
      goto LAB_002c15d7;
    }
  }
  else {
    this_00 = this;
    if (in_ECX == 0) {
      pLVar8 = (List<Kernel::Clause_*> *)lits[9];
LAB_002c119d:
      pp_Var4 = (_func_int **)
                ::Lib::FixedSizeAllocator<24UL>::alloc
                          ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                          );
      *(undefined4 *)(pp_Var4 + 1) = 0;
      *pp_Var4 = (_func_int *)&PTR__IteratorCore_00b535a8;
      pp_Var4[2] = (_func_int *)pLVar8;
      (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex = pp_Var4;
      *(undefined4 *)(pp_Var4 + 1) = 1;
      return (ClauseIterator)this;
    }
  }
  pLVar7 = (Literal *)(ulong)in_ECX;
  if (lits[7] <= pLVar7) {
    this_00 = (SubstitutionTreeClauseVariantIndex *)(lits + 6);
    ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
              ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)this_00,
               (size_t)pLVar7);
  }
  pLVar7 = (Literal *)
           (lits[8]->super_Term)._args[(long)((long)&pLVar7[-1].super_Term._args[0]._content + 3)].
           _content;
  if (pLVar7 != (Literal *)0x0) {
    pLVar5 = getMainLiteral(this_00,key,in_ECX);
    LiteralSubstitutionTree<Indexing::LiteralClause>::getVariants
              ((LiteralSubstitutionTree<Indexing::LiteralClause> *)local_140,pLVar7,SUB81(pLVar5,0),
               false);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::ResultClauseToVariantClauseFn
              (&local_98,key,in_ECX);
    local_140._8_8_ = local_98._lits;
    local_130._8_8_ = local_98._queryIndex._obj;
    local_120 = (LiteralMiniIndex *)local_98._queryIndex._refCnt;
    if ((LiteralMiniIndex *)local_98._queryIndex._refCnt != (LiteralMiniIndex *)0x0 &&
        local_98._queryIndex._obj != (LiteralMiniIndex *)0x0) {
      iVar1 = *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                          *)&(local_98._queryIndex._refCnt)->_val)->
                       super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                       .
                       super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>
                       ._M_head_impl;
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_98._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl = iVar1 + 1;
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_98._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl = iVar1 + 2;
    }
    local_f0._length = local_98._length;
    local_f0._queryIndex._refCnt = local_98._queryIndex._refCnt;
    local_f0._queryIndex._obj = local_98._queryIndex._obj;
    local_f0._lits = local_98._lits;
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)(local_140 + 8));
    uVar2 = local_140._0_8_;
    if ((_func_int **)local_140._0_8_ != (_func_int **)0x0) {
      *(int *)(local_140._0_8_ + 8) = *(int *)(local_140._0_8_ + 8) + 1;
    }
    local_130._0_4_ = local_f0._length;
    local_140._8_8_ = local_f0._lits;
    local_130._8_8_ = local_f0._queryIndex._obj;
    local_120 = (LiteralMiniIndex *)local_f0._queryIndex._refCnt;
    if ((LiteralMiniIndex *)local_f0._queryIndex._refCnt != (LiteralMiniIndex *)0x0 &&
        local_f0._queryIndex._obj != (LiteralMiniIndex *)0x0) {
      iVar1 = *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                          *)&(local_f0._queryIndex._refCnt)->_val)->
                       super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                       .
                       super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>
                       ._M_head_impl;
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_f0._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl = iVar1 + 1;
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_f0._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl = iVar1 + 2;
    }
    local_c8._length = local_f0._length;
    local_c8._queryIndex._refCnt = local_f0._queryIndex._refCnt;
    local_c8._queryIndex._obj = local_f0._queryIndex._obj;
    local_c8._lits = local_f0._lits;
    local_a0 = (_func_int **)local_140._0_8_;
    if ((_func_int **)local_140._0_8_ == (_func_int **)0x0) {
      ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
                ((ResultClauseToVariantClauseFn *)(local_140 + 8));
    }
    else {
      *(int *)(local_140._0_8_ + 8) = *(int *)(local_140._0_8_ + 8) + 1;
      ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
                ((ResultClauseToVariantClauseFn *)(local_140 + 8));
      pp_Var4 = (_func_int **)(uVar2 + 8);
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*(_func_int **)uVar2 + 8))(uVar2);
      }
    }
    local_130._0_4_ = local_c8._length;
    local_140._8_8_ = local_c8._lits;
    local_130._8_8_ = local_c8._queryIndex._obj;
    local_120 = (LiteralMiniIndex *)local_c8._queryIndex._refCnt;
    if ((LiteralMiniIndex *)local_c8._queryIndex._refCnt != (LiteralMiniIndex *)0x0 &&
        local_c8._queryIndex._obj != (LiteralMiniIndex *)0x0) {
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_c8._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl =
           *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                       *)&(local_c8._queryIndex._refCnt)->_val)->
                    super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                    .
                    super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>
                    ._M_head_impl + 1;
    }
    local_110 = local_a0;
    if (local_a0 != (_func_int **)0x0) {
      *(int *)(local_a0 + 1) = *(int *)(local_a0 + 1) + 1;
    }
    local_70._length = local_c8._length;
    local_70._lits = local_c8._lits;
    local_70._queryIndex._obj = local_c8._queryIndex._obj;
    local_70._queryIndex._refCnt = local_c8._queryIndex._refCnt;
    if ((LiteralMiniIndex *)local_c8._queryIndex._refCnt != (LiteralMiniIndex *)0x0 &&
        local_c8._queryIndex._obj != (LiteralMiniIndex *)0x0) {
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_c8._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl =
           *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                       *)&(local_c8._queryIndex._refCnt)->_val)->
                    super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                    .
                    super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>
                    ._M_head_impl + 1;
    }
    local_48 = local_a0;
    if (local_a0 == (_func_int **)0x0) {
      local_40 = 0;
      uStack_38 = 0;
    }
    else {
      iVar1 = *(int *)(local_a0 + 1);
      local_40 = 0;
      uStack_38 = 0;
      *(int *)(local_a0 + 1) = iVar1;
      if (iVar1 == 0) {
        (**(code **)(*local_a0 + 8))();
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)(local_140 + 8));
    pp_Var4 = (_func_int **)::operator_new(0x58,8);
    local_130._8_4_ = local_70._length;
    local_130._0_8_ = local_70._lits;
    local_120 = local_70._queryIndex._obj;
    local_118 = (LiteralMiniIndex *)local_70._queryIndex._refCnt;
    if ((LiteralMiniIndex *)local_70._queryIndex._refCnt != (LiteralMiniIndex *)0x0 &&
        local_70._queryIndex._obj != (LiteralMiniIndex *)0x0) {
      *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                  *)&(local_70._queryIndex._refCnt)->_val)->
               super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               )._M_t.
               super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
               .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
               _M_head_impl =
           *(int *)&(((__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>,_true,_true>
                       *)&(local_70._queryIndex._refCnt)->_val)->
                    super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
                    .
                    super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>
                    ._M_head_impl + 1;
    }
    local_108 = local_48;
    if (local_48 != (_func_int **)0x0) {
      *(int *)(local_48 + 1) = *(int *)(local_48 + 1) + 1;
    }
    local_100 = (char)local_40;
    if ((char)local_40 == '\x01') {
      local_f8 = uStack_38;
    }
    *(undefined4 *)(pp_Var4 + 1) = 0;
    *pp_Var4 = (_func_int *)&PTR__ProxyIterator_00b53918;
    ::Lib::
    FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Indexing/ClauseVariantIndex.cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)(pp_Var4 + 2),
                       (FilteredIterator<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::CompositionFn<Indexing::ClauseVariantIndex::ResultClauseToVariantClauseFn,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_ClauseVariantIndex_cpp:132:68)>,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                        *)(local_140 + 8));
    *(int *)(pp_Var4 + 1) = *(int *)(pp_Var4 + 1) + 1;
    (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex = pp_Var4;
    if (local_108 != (_func_int **)0x0) {
      pp_Var4 = local_108 + 1;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*local_108 + 8))();
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn
              ((ResultClauseToVariantClauseFn *)local_130);
    if (local_48 != (_func_int **)0x0) {
      pp_Var4 = local_48 + 1;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*local_48 + 8))();
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_70);
    if (local_a0 != (_func_int **)0x0) {
      pp_Var4 = local_a0 + 1;
      *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
      if (*(int *)pp_Var4 == 0) {
        (**(code **)(*local_a0 + 8))();
      }
    }
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_c8);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_f0);
    ClauseVariantIndex::ResultClauseToVariantClauseFn::~ResultClauseToVariantClauseFn(&local_98);
    if ((_func_int **)local_140._0_8_ == (_func_int **)0x0) {
      return (ClauseIterator)this;
    }
    pp_Var4 = (_func_int **)(local_140._0_8_ + 8);
    *(int *)pp_Var4 = *(int *)pp_Var4 + -1;
    if (*(int *)pp_Var4 != 0) {
      return (ClauseIterator)this;
    }
    (**(code **)(*(_func_int **)local_140._0_8_ + 8))();
    return (ClauseIterator)this;
  }
LAB_002c15d7:
  ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator SubstitutionTreeClauseVariantIndex::retrieveVariants(Literal* const * lits, unsigned length)
{
  if(length==0) {
    return pvi( ClauseList::Iterator(_emptyClauses) );
  }
  if(length==1 && lits[0]->ground()) {
    ClauseList* lst;
    if(_groundUnits.find(lits[0], lst)) {
      ASS(lst);
      return pvi( ClauseList::Iterator(lst) );
    }
    else {
      return ClauseIterator::getEmpty();
    }
  }

  LiteralSubstitutionTree* index=_strees[length];
  if(!index) {
    return ClauseIterator::getEmpty();
  }

  Literal* mainLit=getMainLiteral(lits, length);
  return pvi( getFilteredIterator(
    getMappingIterator(
      index->getVariants(mainLit, false, false),
      getCompositionFn(ResultClauseToVariantClauseFn(lits, length),[](auto qr) { return qr.data->clause; })),
    NonzeroFn()) );
}